

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttsvg.c
# Opt level: O0

Svg_doc * extract_svg_doc(Svg_doc *__return_storage_ptr__,FT_Byte *stream)

{
  FT_Byte *stream_local;
  
  __return_storage_ptr__->start_glyph_id = CONCAT11(*stream,stream[1]);
  __return_storage_ptr__->end_glyph_id = CONCAT11(stream[2],stream[3]);
  __return_storage_ptr__->offset =
       (ulong)((uint)stream[4] << 0x18 | (uint)stream[5] << 0x10 | (uint)stream[6] << 8 |
              (uint)stream[7]);
  __return_storage_ptr__->length =
       (ulong)((uint)stream[8] << 0x18 | (uint)stream[9] << 0x10 | (uint)stream[10] << 8 |
              (uint)stream[0xb]);
  return __return_storage_ptr__;
}

Assistant:

static Svg_doc
  extract_svg_doc( FT_Byte*  stream )
  {
    Svg_doc  doc;


    doc.start_glyph_id = FT_NEXT_USHORT( stream );
    doc.end_glyph_id   = FT_NEXT_USHORT( stream );

    doc.offset = FT_NEXT_ULONG( stream );
    doc.length = FT_NEXT_ULONG( stream );

    return doc;
  }